

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

SmallBuffer * helics::emptyBlock(DataType outputType,DataType inputType)

{
  string_view valname;
  int in_EDX;
  undefined4 in_ESI;
  SmallBuffer *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  NamedPoint *in_stack_fffffffffffffe48;
  basic_string_view<char,_std::char_traits<char>_> *val;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  SmallBuffer *pSVar1;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe80;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_138 [2];
  __sv_type local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined8 local_d8;
  __sv_type local_a8;
  undefined1 local_68 [56];
  complex<double> local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  switch(in_ESI) {
  case 0:
  case 9:
    if (in_EDX == 4) {
      local_e8._M_len = 0;
      local_e8._M_str = (char *)0x0;
      local_d8 = 0;
      val = &local_e8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x4368cd);
      helicsVectorString_abi_cxx11_(in_stack_fffffffffffffe80);
      local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe30)
      ;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert(val);
      std::__cxx11::string::~string(in_stack_fffffffffffffe30);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40);
    }
    else if (in_EDX == 5) {
      local_138[0].super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138[0].super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138[0].super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this = local_138;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x4369a3);
      helicsComplexVectorString_abi_cxx11_
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe80);
      local_f8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe30)
      ;
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48);
      std::__cxx11::string::~string(in_stack_fffffffffffffe30);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(this);
    }
    else if (in_EDX == 6) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48);
    }
    break;
  case 1:
  default:
    local_18 = 0;
    ValueConverter<double>::convert((double *)in_stack_fffffffffffffe48);
    break;
  case 2:
  case 8:
    local_20 = 0;
    ValueConverter<long>::convert((long *)in_stack_fffffffffffffe48);
    break;
  case 3:
    std::complex<double>::complex(&local_30,0.0,0.0);
    ValueConverter<std::complex<double>_>::convert((complex<double> *)in_stack_fffffffffffffe48);
    break;
  case 4:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x436afb);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe48);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40);
    break;
  case 5:
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x436a9e);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
            in_stack_fffffffffffffe48);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe40);
    break;
  case 6:
    pSVar1 = in_RDI;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    nan("0");
    valname._M_str = (char *)pSVar1;
    valname._M_len = (size_t)local_68;
    NamedPoint::NamedPoint
              ((NamedPoint *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),valname,
               (double)in_stack_fffffffffffffe48);
    ValueConverter<helics::NamedPoint>::convert(in_stack_fffffffffffffe48);
    NamedPoint::~NamedPoint((NamedPoint *)0x43681e);
    break;
  case 7:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48);
  }
  return in_RDI;
}

Assistant:

SmallBuffer emptyBlock(DataType outputType, DataType inputType = DataType::HELICS_ANY)
{
    switch (outputType) {
        case DataType::HELICS_DOUBLE:
        default:
            return ValueConverter<double>::convert(0.0);
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(0);
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(std::complex<double>(0.0, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert("0");
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{"", std::nan("0")});
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            switch (inputType) {
                default:
                    return ValueConverter<std::string_view>::convert("");
                case DataType::HELICS_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsVectorString(std::vector<double>()));
                case DataType::HELICS_COMPLEX_VECTOR:
                    return ValueConverter<std::string_view>::convert(
                        helicsComplexVectorString(std::vector<std::complex<double>>()));
                case DataType::HELICS_NAMED_POINT:
                    return ValueConverter<std::string_view>::convert("0");
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                std::vector<std::complex<double>>());
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(std::vector<double>());
    }
}